

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O0

void InitBlockEncoder(BlockEncoder *self,size_t histogram_length,size_t num_block_types,
                     uint8_t *block_types,uint32_t *block_lengths,size_t num_blocks)

{
  uint local_3c;
  size_t num_blocks_local;
  uint32_t *block_lengths_local;
  uint8_t *block_types_local;
  size_t num_block_types_local;
  size_t histogram_length_local;
  BlockEncoder *self_local;
  
  self->histogram_length_ = histogram_length;
  self->num_block_types_ = num_block_types;
  self->block_types_ = block_types;
  self->block_lengths_ = block_lengths;
  self->num_blocks_ = num_blocks;
  InitBlockTypeCodeCalculator(&(self->block_split_code_).type_code_calculator);
  self->block_ix_ = 0;
  if (num_blocks == 0) {
    local_3c = 0;
  }
  else {
    local_3c = *block_lengths;
  }
  self->block_len_ = (ulong)local_3c;
  self->entropy_ix_ = 0;
  self->depths_ = (uint8_t *)0x0;
  self->bits_ = (uint16_t *)0x0;
  return;
}

Assistant:

static void InitBlockEncoder(BlockEncoder* self, size_t histogram_length,
    size_t num_block_types, const uint8_t* block_types,
    const uint32_t* block_lengths, const size_t num_blocks) {
  self->histogram_length_ = histogram_length;
  self->num_block_types_ = num_block_types;
  self->block_types_ = block_types;
  self->block_lengths_ = block_lengths;
  self->num_blocks_ = num_blocks;
  InitBlockTypeCodeCalculator(&self->block_split_code_.type_code_calculator);
  self->block_ix_ = 0;
  self->block_len_ = num_blocks == 0 ? 0 : block_lengths[0];
  self->entropy_ix_ = 0;
  self->depths_ = 0;
  self->bits_ = 0;
}